

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingerprint.cpp
# Opt level: O0

string * libtorrent::generate_fingerprint
                   (string *__return_storage_ptr__,string *name,int major,int minor,int revision,
                   int tag)

{
  undefined1 uVar1;
  char cVar2;
  ulong uVar3;
  undefined1 *puVar4;
  char *pcVar5;
  int tag_local;
  int revision_local;
  int minor_local;
  int major_local;
  string *name_local;
  string *ret;
  
  uVar3 = ::std::__cxx11::string::size();
  if (uVar3 < 2) {
    ::std::__cxx11::string::operator=((string *)name,"--");
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar4 = 0x2d;
  puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)name);
  uVar1 = *puVar4;
  puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar4 = uVar1;
  puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)name);
  uVar1 = *puVar4;
  puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar4 = uVar1;
  cVar2 = anon_unknown_2::version_to_char(major);
  pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *pcVar5 = cVar2;
  cVar2 = anon_unknown_2::version_to_char(minor);
  pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *pcVar5 = cVar2;
  cVar2 = anon_unknown_2::version_to_char(revision);
  pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *pcVar5 = cVar2;
  cVar2 = anon_unknown_2::version_to_char(tag);
  pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *pcVar5 = cVar2;
  puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar4 = 0x2d;
  return __return_storage_ptr__;
}

Assistant:

std::string generate_fingerprint(std::string name, int const major
		, int const minor
		, int const revision
		, int const tag)
	{
		TORRENT_ASSERT_PRECOND(major >= 0);
		TORRENT_ASSERT_PRECOND(minor >= 0);
		TORRENT_ASSERT_PRECOND(revision >= 0);
		TORRENT_ASSERT_PRECOND(tag >= 0);
		TORRENT_ASSERT_PRECOND(name.size() == 2);
		if (name.size() < 2) name = "--";

		std::string ret;
		ret.resize(8);
		ret[0] = '-';
		ret[1] = name[0];
		ret[2] = name[1];
		ret[3] = version_to_char(major);
		ret[4] = version_to_char(minor);
		ret[5] = version_to_char(revision);
		ret[6] = version_to_char(tag);
		ret[7] = '-';
		return ret;
	}